

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

ggml_bf16_t f32_to_bf16(float x)

{
  if (0x7f800000 < (uint)ABS(x)) {
    return (ggml_bf16_t)((ushort)((uint)x >> 0x10) | 0x40);
  }
  return (ggml_bf16_t)(uint16_t)((int)x + 0x7fff + ((uint)x >> 0x10 & 1) >> 0x10);
}

Assistant:

static inline ggml_bf16_t f32_to_bf16(float x) {
    return GGML_FP32_TO_BF16(x);
}